

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerLdAtomicsWasm(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  Opnd *dst;
  Opnd *addrOpnd;
  code *pcVar2;
  bool bVar3;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar4;
  Instr *insertBeforeInstr;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar3 = JITTimeFunctionBody::IsWasmFunction(this_00);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x264e,"(m_func->GetJITFunctionBody()->IsWasmFunction())",
                       "m_func->GetJITFunctionBody()->IsWasmFunction()");
    if (!bVar3) goto LAB_005abfbd;
    *puVar4 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x264f,"(instr)","instr");
    if (!bVar3) goto LAB_005abfbd;
    *puVar4 = 0;
  }
  if (instr->m_opcode != LdAtomicWasm) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2650,"(instr->m_opcode == Js::OpCode::LdAtomicWasm)",
                       "instr->m_opcode == Js::OpCode::LdAtomicWasm");
    if (!bVar3) goto LAB_005abfbd;
    *puVar4 = 0;
  }
  pIVar1 = instr->m_prev;
  dst = instr->m_dst;
  addrOpnd = instr->m_src1;
  bVar3 = IRType_IsNativeInt(dst->m_type);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2657,"(IRType_IsNativeInt(dst->GetType()))",
                       "IRType_IsNativeInt(dst->GetType())");
    if (!bVar3) {
LAB_005abfbd:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  insertBeforeInstr = LowerWasmArrayBoundsCheck(this,instr,addrOpnd);
  LowererMD::LowerAtomicLoad(&this->m_lowererMD,dst,addrOpnd,insertBeforeInstr);
  IR::Instr::Remove(instr);
  return pIVar1;
}

Assistant:

IR::Instr * Lowerer::LowerLdAtomicsWasm(IR::Instr * instr)
{
#ifdef ENABLE_WASM
    Assert(m_func->GetJITFunctionBody()->IsWasmFunction());
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::LdAtomicWasm);

    IR::Instr * instrPrev = instr->m_prev;

    IR::Opnd * dst = instr->GetDst();
    IR::Opnd * src1 = instr->GetSrc1();

    Assert(IRType_IsNativeInt(dst->GetType()));

    IR::Instr * done = LowerWasmArrayBoundsCheck(instr, src1);
    m_lowererMD.LowerAtomicLoad(dst, src1, done);

    instr->Remove();
    return instrPrev;
#else
    Assert(UNREACHED);
    return instr;
#endif
}